

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::anon_unknown_14::matchesAny
               (char *name,vector<doctest::String,_std::allocator<doctest::String>_> *filters,
               bool matchEmpty,bool caseSensitive)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte in_CL;
  byte bVar4;
  byte in_DL;
  char *in_RSI;
  vector<doctest::String,_std::allocator<doctest::String>_> *in_RDI;
  String *curr;
  const_iterator __end2;
  const_iterator __begin2;
  vector<doctest::String,_std::allocator<doctest::String>_> *__range2;
  vector<doctest::String,_std::allocator<doctest::String>_> *in_stack_ffffffffffffffb8;
  reference in_stack_ffffffffffffffc0;
  __normal_iterator<const_doctest::String_*,_std::vector<doctest::String,_std::allocator<doctest::String>_>_>
  in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffe0;
  char *str;
  bool local_1;
  
  bVar4 = in_DL & 1;
  bVar1 = in_CL & 1;
  bVar2 = std::vector<doctest::String,_std::allocator<doctest::String>_>::empty
                    ((vector<doctest::String,_std::allocator<doctest::String>_> *)
                     in_stack_ffffffffffffffd0._M_current);
  if ((bVar2) && ((bVar4 & 1) != 0)) {
    local_1 = true;
  }
  else {
    str = in_RSI;
    std::vector<doctest::String,_std::allocator<doctest::String>_>::begin(in_stack_ffffffffffffffb8)
    ;
    std::vector<doctest::String,_std::allocator<doctest::String>_>::end(in_stack_ffffffffffffffb8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_doctest::String_*,_std::vector<doctest::String,_std::allocator<doctest::String>_>_>
                               *)in_stack_ffffffffffffffc0,
                              (__normal_iterator<const_doctest::String_*,_std::vector<doctest::String,_std::allocator<doctest::String>_>_>
                               *)in_stack_ffffffffffffffb8), bVar2) {
      in_stack_ffffffffffffffc0 =
           __gnu_cxx::
           __normal_iterator<const_doctest::String_*,_std::vector<doctest::String,_std::allocator<doctest::String>_>_>
           ::operator*((__normal_iterator<const_doctest::String_*,_std::vector<doctest::String,_std::allocator<doctest::String>_>_>
                        *)&stack0xffffffffffffffd0);
      in_stack_ffffffffffffffb8 = in_RDI;
      String::c_str((String *)0x10b76f);
      iVar3 = wildcmp(str,(char *)CONCAT17(bVar4,CONCAT16(bVar1,in_stack_ffffffffffffffe0)),
                      SUB81((ulong)in_RSI >> 0x38,0));
      if (iVar3 != 0) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<const_doctest::String_*,_std::vector<doctest::String,_std::allocator<doctest::String>_>_>
      ::operator++((__normal_iterator<const_doctest::String_*,_std::vector<doctest::String,_std::allocator<doctest::String>_>_>
                    *)&stack0xffffffffffffffd0);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool matchesAny(const char* name, const std::vector<String>& filters, bool matchEmpty,
                    bool caseSensitive) {
        if(filters.empty() && matchEmpty)
            return true;
        for(auto& curr : filters)
            if(wildcmp(name, curr.c_str(), caseSensitive))
                return true;
        return false;
    }